

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_destroy_cstr_index(opj_codestream_index_t *p_cstr_ind)

{
  void *pvVar1;
  opj_tile_index_t *ptr;
  long lVar2;
  ulong uVar3;
  
  if (p_cstr_ind != (opj_codestream_index_t *)0x0) {
    if (p_cstr_ind->marker != (opj_marker_info_t *)0x0) {
      opj_free(p_cstr_ind->marker);
      p_cstr_ind->marker = (opj_marker_info_t *)0x0;
    }
    ptr = p_cstr_ind->tile_index;
    if (ptr != (opj_tile_index_t *)0x0) {
      if (p_cstr_ind->nb_of_tiles != 0) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          pvVar1 = *(void **)((long)&ptr->packet_index + lVar2);
          if (pvVar1 != (void *)0x0) {
            opj_free(pvVar1);
            ptr = p_cstr_ind->tile_index;
            *(undefined8 *)((long)&ptr->packet_index + lVar2) = 0;
          }
          pvVar1 = *(void **)((long)&ptr->tp_index + lVar2);
          if (pvVar1 != (void *)0x0) {
            opj_free(pvVar1);
            ptr = p_cstr_ind->tile_index;
            *(undefined8 *)((long)&ptr->tp_index + lVar2) = 0;
          }
          pvVar1 = *(void **)((long)&ptr->marker + lVar2);
          if (pvVar1 != (void *)0x0) {
            opj_free(pvVar1);
            ptr = p_cstr_ind->tile_index;
            *(undefined8 *)((long)&ptr->marker + lVar2) = 0;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x38;
        } while (uVar3 < p_cstr_ind->nb_of_tiles);
      }
      opj_free(ptr);
      p_cstr_ind->tile_index = (opj_tile_index_t *)0x0;
    }
    opj_free(p_cstr_ind);
    return;
  }
  return;
}

Assistant:

void j2k_destroy_cstr_index (opj_codestream_index_t *p_cstr_ind)
{
        if (p_cstr_ind) {

                if (p_cstr_ind->marker) {
                        opj_free(p_cstr_ind->marker);
                        p_cstr_ind->marker = NULL;
                }

                if (p_cstr_ind->tile_index) {
                        OPJ_UINT32 it_tile = 0;

                        for (it_tile=0; it_tile < p_cstr_ind->nb_of_tiles; it_tile++) {

                                if(p_cstr_ind->tile_index[it_tile].packet_index) {
                                        opj_free(p_cstr_ind->tile_index[it_tile].packet_index);
                                        p_cstr_ind->tile_index[it_tile].packet_index = NULL;
                                }

                                if(p_cstr_ind->tile_index[it_tile].tp_index){
                                        opj_free(p_cstr_ind->tile_index[it_tile].tp_index);
                                        p_cstr_ind->tile_index[it_tile].tp_index = NULL;
                                }

                                if(p_cstr_ind->tile_index[it_tile].marker){
                                        opj_free(p_cstr_ind->tile_index[it_tile].marker);
                                        p_cstr_ind->tile_index[it_tile].marker = NULL;

                                }
                        }

                        opj_free( p_cstr_ind->tile_index);
                        p_cstr_ind->tile_index = NULL;
                }

                opj_free(p_cstr_ind);
        }
}